

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O3

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::
computeElastPendulumForcesAndMoments1
          (IMUElasticLocalFrameDynamicalSystem *this,IndexedMatrixArray *PrArray,Vector3 *position,
          Vector3 *linVelocity,Vector3 *oriVector,Matrix3 *orientation,Vector3 *angVel,
          Vector *forces,Vector *moments)

{
  iterator *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  uint uVar9;
  _Map_pointer ppMVar10;
  undefined1 (*pauVar11) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  long lVar25;
  DenseStorage<double,__1,__1,__1,_0> *pDVar26;
  char *pcVar27;
  int iVar28;
  ulong uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  SrcEvaluatorType srcEvaluator;
  Vector3 du;
  Vector3 forcei;
  double dStack_140;
  undefined1 local_130 [56];
  double dStack_f8;
  undefined1 *local_f0;
  undefined1 local_e8 [16];
  Vector3 *local_d0;
  Vector3 *local_c8;
  Vector3 *local_c0;
  double local_b8;
  DenseStorage<double,__1,__1,__1,_0> local_b0;
  Matrix<double,_3,_1,_0,_3,_1> local_98;
  undefined1 local_78 [16];
  double local_68;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_60;
  DenseStorage<double,__1,__1,__1,_0> *local_50;
  undefined1 local_48 [16];
  double local_38;
  
  lVar25 = (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  local_c8 = linVelocity;
  local_c0 = position;
  if (-1 < lVar25) {
    uVar8 = this->nbContacts_;
    if (lVar25 != 0) {
      memset((forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar25 << 3);
    }
    lVar25 = (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (-1 < lVar25) {
      local_d0 = oriVector;
      if (lVar25 != 0) {
        memset((moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data,0,lVar25 << 3);
      }
      if ((ulong)uVar8 != 0) {
        this_00 = &(PrArray->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start;
        uVar29 = 0;
        do {
          ppMVar10 = (PrArray->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          lVar25 = ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                   -0x5555555555555555 +
                   ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                   -0x5555555555555555 +
                   (((long)ppMVar10 -
                     (long)(PrArray->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                   (ulong)(ppMVar10 == (_Map_pointer)0x0)) * 0x15;
          if (lVar25 == 0) {
LAB_001574c3:
            __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                          ,0x9b,
                          "void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
          }
          uVar9 = PrArray->k_;
          if ((uVar29 < uVar9) || (lVar25 + (ulong)uVar9 <= uVar29)) goto LAB_001574c3;
          dVar16 = (local_c0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                   m_storage.m_data.array[0];
          dVar17 = (local_c0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                   m_storage.m_data.array[1];
          dVar1 = (local_c0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                  .m_data.array[2];
          iVar28 = (int)uVar29;
          pDVar26 = (DenseStorage<double,__1,__1,__1,_0> *)
                    std::
                    _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                    ::operator[](this_00,(ulong)(iVar28 - uVar9));
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,__1,_0> *)local_130,pDVar26);
          if ((double)local_130._8_8_ != 1.48219693752374e-323) {
            pcVar27 = 
            "Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 3, 3>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
            ;
LAB_00157582:
            __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar27);
          }
          if (CONCAT44(local_130._20_4_,local_130._16_4_) != 1) {
            pcVar27 = 
            "static void Eigen::internal::Assignment<Eigen::Matrix<double, 3, 1>, Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, -1, -1>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Matrix<double, 3, 1>, SrcXprType = Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
            ;
LAB_00157563:
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,pcVar27);
          }
          dVar2 = *(double *)local_130._0_8_;
          dVar3 = *(double *)(local_130._0_8_ + 8);
          dVar19 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[0];
          dVar20 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[1];
          dVar21 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[3];
          dVar22 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[4];
          dVar23 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[6];
          dVar24 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[7];
          dVar4 = *(double *)(local_130._0_8_ + 0x10);
          dVar5 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                  m_storage.m_data.array[2];
          dVar6 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                  m_storage.m_data.array[5];
          dVar7 = (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                  m_storage.m_data.array[8];
          free((void *)local_130._0_8_);
          dVar16 = (dVar16 + dVar4 * dVar23 + dVar3 * dVar21 + dVar19 * dVar2) -
                   (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[0];
          dVar17 = (dVar17 + dVar4 * dVar24 + dVar3 * dVar22 + dVar20 * dVar2) -
                   (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[1];
          uVar30 = SUB84(dVar17,0);
          uVar31 = (undefined4)((ulong)dVar17 >> 0x20);
          auVar12._8_4_ = uVar30;
          auVar12._0_8_ = dVar16;
          auVar12._12_4_ = uVar31;
          local_78._8_4_ = uVar30;
          local_78._0_8_ = dVar16;
          local_78._12_4_ = uVar31;
          dVar1 = (dVar1 + dVar4 * dVar7 + dVar3 * dVar6 + dVar2 * dVar5) -
                  (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2];
          local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = (local_c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[0];
          local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = (local_c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[1];
          local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = (local_c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[2];
          local_130._0_8_ = (double *)0x0;
          local_130._16_4_ =
               *(undefined4 *)
                ((angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array + 1);
          local_130._40_16_ =
               *(undefined1 (*) [16])
                (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array;
          local_130._24_4_ =
               *(undefined4 *)
                ((angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array + 2);
          local_130._20_4_ =
               *(uint *)((long)(angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               ).m_storage.m_data.array + 0xc) ^ 0x80000000;
          local_130._28_4_ =
               *(uint *)((long)(angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               ).m_storage.m_data.array + 0x14) ^ 0x80000000;
          local_130._32_8_ = (undefined1 *)0x0;
          dStack_f8 = -(angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array[0];
          local_f0 = (undefined1 *)0x0;
          ppMVar10 = (PrArray->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          lVar25 = ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                   -0x5555555555555555 +
                   ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                   -0x5555555555555555 +
                   (((long)ppMVar10 -
                     (long)(PrArray->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                   (ulong)(ppMVar10 == (_Map_pointer)0x0)) * 0x15;
          local_68 = dVar1;
          if (lVar25 == 0) goto LAB_001574c3;
          uVar9 = PrArray->k_;
          if ((uVar29 < uVar9) || (lVar25 + (ulong)uVar9 <= uVar29)) goto LAB_001574c3;
          pDVar26 = (DenseStorage<double,__1,__1,__1,_0> *)
                    std::
                    _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                    ::operator[](this_00,(ulong)(iVar28 - uVar9));
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_b0,pDVar26);
          local_60.m_lhs = (LhsNested)local_130;
          local_60.m_rhs = orientation;
          local_50 = &local_b0;
          if (local_b0.m_rows != 3) {
            pcVar27 = 
            "Eigen::Product<Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, 3, 3>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, 3, 3>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
            ;
            goto LAB_00157582;
          }
          if (local_b0.m_cols != 1) {
            pcVar27 = 
            "static void Eigen::internal::Assignment<Eigen::Matrix<double, 3, 1>, Eigen::Product<Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, 3, 3>>, Eigen::Matrix<double, -1, -1>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Matrix<double, 3, 1>, SrcXprType = Eigen::Product<Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, 3, 3>>, Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
            ;
            goto LAB_00157563;
          }
          Eigen::internal::
          generic_product_impl<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,3>
          ::addTo<Eigen::Matrix<double,3,1,0,3,1>>
                    (&local_98,&local_60,(Matrix<double,__1,__1,_0,__1,__1> *)&local_b0);
          free(local_b0.m_data);
          ppMVar10 = (PrArray->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          lVar25 = ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                   -0x5555555555555555 +
                   ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                   -0x5555555555555555 +
                   (((long)ppMVar10 -
                     (long)(PrArray->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                   (ulong)(ppMVar10 == (_Map_pointer)0x0)) * 0x15;
          if (lVar25 == 0) goto LAB_001574c3;
          uVar9 = PrArray->k_;
          if ((uVar29 < uVar9) || (lVar25 + (ulong)uVar9 <= uVar29)) goto LAB_001574c3;
          pDVar26 = (DenseStorage<double,__1,__1,__1,_0> *)
                    std::
                    _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                    ::operator[](this_00,(ulong)(iVar28 - uVar9));
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,__1,_0> *)local_130,pDVar26);
          if (((double)local_130._8_8_ != 1.48219693752374e-323) ||
             (CONCAT44(local_130._20_4_,local_130._16_4_) != 1)) {
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, 3, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, 3, 1>]"
                         );
          }
          dVar17 = *(double *)local_130._0_8_ -
                   (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[0];
          dVar3 = *(double *)(local_130._0_8_ + 8) -
                  (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1];
          dVar2 = *(double *)(local_130._0_8_ + 0x10) -
                  (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2];
          local_b8 = dVar2 * dVar2 + dVar3 * dVar3 + dVar17 * dVar17;
          free((void *)local_130._0_8_);
          dStack_140 = auVar12._8_8_;
          local_130._8_8_ = SQRT(dVar1 * dVar1 + dStack_140 * dStack_140 + dVar16 * dVar16);
          local_130._8_8_ = -((double)local_130._8_8_ - SQRT(local_b8)) / (double)local_130._8_8_;
          local_130._32_8_ = local_130 + 0x28;
          dVar17 = (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[6] * local_68 +
                   (double)local_78._8_8_ *
                   (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[3] +
                   (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[0] * dVar16;
          dVar2 = (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[7] * local_68 +
                  (double)local_78._8_8_ *
                  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[4] +
                  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[1] * dVar16;
          local_130._48_4_ = SUB84(dVar2,0);
          local_130._40_8_ = dVar17;
          local_130._52_4_ = (int)((ulong)dVar2 >> 0x20);
          dStack_f8 = dVar1 * (this->KfeRopes_).
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[8] +
                      (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      .m_storage.m_data.array[5] * (double)local_78._8_8_ +
                      (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      .m_storage.m_data.array[2] * dVar16;
          local_f0 = local_e8;
          dVar1 = (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[6] *
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] +
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] *
                  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[3] +
                  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[0] *
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
          dVar16 = (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[7] *
                   local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] +
                   local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] *
                   (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[4] +
                   (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[1] *
                   local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
          local_e8._8_4_ = SUB84(dVar16,0);
          local_e8._0_8_ = dVar1;
          local_e8._12_4_ = (int)((ulong)dVar16 >> 0x20);
          local_38 = (local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] *
                      (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      .m_storage.m_data.array[8] +
                      local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1] *
                      (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      .m_storage.m_data.array[5] +
                      local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] *
                      (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      .m_storage.m_data.array[2] + dStack_f8) * (double)local_130._8_8_;
          dVar1 = (dVar1 + dVar17) * (double)local_130._8_8_;
          dVar16 = (dVar16 + dVar2) * (double)local_130._8_8_;
          local_48._8_4_ = SUB84(dVar16,0);
          local_48._0_8_ = dVar1;
          local_48._12_4_ = (int)((ulong)dVar16 >> 0x20);
          if ((forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows < 3) goto LAB_001574e2;
          pauVar11 = (undefined1 (*) [16])
                     (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
          dVar16 = *(double *)(*pauVar11 + 8) + dVar16;
          auVar18._8_4_ = SUB84(dVar16,0);
          auVar18._0_8_ = *(double *)*pauVar11 + dVar1;
          auVar18._12_4_ = (int)((ulong)dVar16 >> 0x20);
          *pauVar11 = auVar18;
          *(double *)pauVar11[1] = local_38 + *(double *)pauVar11[1];
          if ((moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows < 3) goto LAB_001574e2;
          pauVar11 = (undefined1 (*) [16])
                     (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
          dVar16 = *(double *)(*pauVar11 + 8) +
                   (double)local_48._8_8_ * 0.0 + dVar1 * local_68 +
                   local_38 * -(double)local_78._0_8_;
          auVar13._8_4_ = SUB84(dVar16,0);
          auVar13._0_8_ =
               *(double *)*pauVar11 +
               (double)local_48._8_8_ * -local_68 + dVar1 * 0.0 + local_38 * (double)local_78._8_8_;
          auVar13._12_4_ = (int)((ulong)dVar16 >> 0x20);
          *pauVar11 = auVar13;
          *(double *)pauVar11[1] =
               ((local_38 * 0.0 + (double)local_78._0_8_ * (double)local_48._8_8_) -
               (double)local_78._8_8_ * dVar1) + *(double *)pauVar11[1];
          uVar29 = uVar29 + 1;
        } while (uVar8 != uVar29);
      }
      if (2 < (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows) {
        pauVar11 = (undefined1 (*) [16])
                   (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
        dVar16 = (local_d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[0];
        dVar17 = (local_d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[1];
        dVar2 = (local_d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[2];
        dVar1 = *(double *)(*pauVar11 + 8) +
                ((dVar16 * -(this->KteRopes_).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[1] -
                 dVar17 * (this->KteRopes_).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[4]) -
                dVar2 * (this->KteRopes_).
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[7]);
        auVar14._8_4_ = SUB84(dVar1,0);
        auVar14._0_8_ =
             *(double *)*pauVar11 +
             ((dVar16 * -(this->KteRopes_).
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[0] -
              dVar17 * (this->KteRopes_).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[3]) -
             dVar2 * (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[6]);
        auVar14._12_4_ = (int)((ulong)dVar1 >> 0x20);
        *pauVar11 = auVar14;
        *(double *)pauVar11[1] =
             ((-(this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array[8] *
               (local_d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2] -
              (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array[5] *
              (local_d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1]) -
             (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2] *
             (local_d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0]) + *(double *)pauVar11[1];
        if (2 < (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
          pauVar11 = (undefined1 (*) [16])
                     (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
          dVar16 = (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[0];
          dVar17 = (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[1];
          dVar2 = (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[2];
          dVar1 = *(double *)(*pauVar11 + 8) +
                  ((dVar16 * -(this->KtvRopes_).
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[1] -
                   dVar17 * (this->KtvRopes_).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[4]) -
                  dVar2 * (this->KtvRopes_).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[7]);
          auVar15._8_4_ = SUB84(dVar1,0);
          auVar15._0_8_ =
               *(double *)*pauVar11 +
               ((dVar16 * -(this->KtvRopes_).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array[0] -
                dVar17 * (this->KtvRopes_).
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[3]) -
               dVar2 * (this->KtvRopes_).
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[6]);
          auVar15._12_4_ = (int)((ulong)dVar1 >> 0x20);
          *pauVar11 = auVar15;
          *(double *)pauVar11[1] =
               ((-(this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[8] *
                 (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[2] -
                (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array[5] *
                (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[1]) -
               (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2] *
               (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0]) + *(double *)pauVar11[1];
          if (this->printed_ == false) {
            this->printed_ = true;
          }
          return;
        }
      }
LAB_001574e2:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                   );
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void IMUElasticLocalFrameDynamicalSystem::computeElastPendulumForcesAndMoments1
                              (const IndexedMatrixArray& PrArray,
                               const Vector3& position, const Vector3& linVelocity,
                               const Vector3& oriVector, const Matrix3& orientation,
                               const Vector3& angVel,
                               Vector& forces, Vector& moments)
    {
        unsigned nbContacts(getContactsNumber());
        forces.setZero(); moments.setZero();

        stateObservation::Vector3 forcei;
        stateObservation::Vector3 momenti;
        stateObservation::Vector3 u, du;

        double ropeLength;
        double modifiedRopeLength;
        double lengthRate;

        for (unsigned i = 0; i<nbContacts ; ++i)
        {
            u = position;
            u.noalias() += orientation*PrArray[i] ;
            u.noalias() -= pe;

            du = linVelocity;
            du.noalias() += kine::skewSymmetric(angVel)*orientation*PrArray[i] ;

            ropeLength=(PrArray[i]-pe).norm();
            modifiedRopeLength=u.norm();

            lengthRate=(modifiedRopeLength-ropeLength)/modifiedRopeLength;

            forcei = -lengthRate*(KfeRopes_*u+KfvRopes_*du);
            forces.segment<3>(0) += forcei;

            momenti.noalias() = kine::skewSymmetric(u)*forcei;
            moments.segment<3>(0) += momenti;
        }

        moments.segment<3>(0).noalias() += - KteRopes_*oriVector;
        moments.segment<3>(0).noalias() += - KtvRopes_*angVel;

        if(printed_==false)
        {
    //            std::cout << "ropeLength=" << ropeLength << std::endl;
    //        std::cout << "modifiedRopeLength=" << modifiedRopeLength << std::endl;
    //            std::cout << "contactOriUnitVector=" << contactOriUnitVector.transpose() << std::endl;
    //            std::cout << "forcei=" << forcei.transpose() << std::endl;
    //            std::cout << "momenti=" << momenti.transpose() << std::endl;
            printed_=true;
        }

    }